

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O1

pair<std::error_code,_std::shared_ptr<ylt::metric::basic_static_gauge<long>_>_> * __thiscall
ylt::metric::static_metric_manager<test_id_t<9ul>>::
create_metric_static<ylt::metric::basic_static_gauge<long>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
          (pair<std::error_code,_std::shared_ptr<ylt::metric::basic_static_gauge<long>_>_>
           *__return_storage_ptr__,void *this,string *name,string *help,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *args)

{
  bool bVar1;
  error_category *peVar2;
  shared_ptr<ylt::metric::basic_static_gauge<long>_> m;
  undefined1 local_41;
  basic_static_gauge<long> *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  shared_ptr<ylt::metric::static_metric> local_30;
  
  local_40 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ylt::metric::basic_static_gauge<long>,std::allocator<ylt::metric::basic_static_gauge<long>>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            (&local_38,&local_40,(allocator<ylt::metric::basic_static_gauge<long>_> *)&local_41,name
             ,help,args);
  local_30.super___shared_ptr<ylt::metric::static_metric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_40;
  local_30.super___shared_ptr<ylt::metric::static_metric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_38._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  bVar1 = static_metric_manager<test_id_t<9UL>_>::register_metric
                    ((static_metric_manager<test_id_t<9UL>_> *)this,&local_30);
  if (local_30.super___shared_ptr<ylt::metric::static_metric,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<ylt::metric::static_metric,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (bVar1) {
    peVar2 = (error_category *)std::_V2::system_category();
    (__return_storage_ptr__->first)._M_value = 0;
    (__return_storage_ptr__->first)._M_cat = peVar2;
    (__return_storage_ptr__->second).
    super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_40;
    (__return_storage_ptr__->second).
    super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_38._M_pi;
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      }
    }
  }
  else {
    peVar2 = (error_category *)std::_V2::generic_category();
    (__return_storage_ptr__->first)._M_value = 0x16;
    (__return_storage_ptr__->first)._M_cat = peVar2;
    (__return_storage_ptr__->second).
    super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->second).
    super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::error_code, std::shared_ptr<T>> create_metric_static(
      const std::string& name, const std::string& help, Args&&... args) {
    auto m = std::make_shared<T>(name, help, std::forward<Args>(args)...);
    bool r = register_metric(m);
    if (!r) {
      return std::make_pair(std::make_error_code(std::errc::invalid_argument),
                            nullptr);
    }

    return std::make_pair(std::error_code{}, m);
  }